

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uni_event_list.c
# Opt level: O3

int EventListDestroy(EventListHandle handle)

{
  *(undefined4 *)((long)handle + 0x78) = 0;
  uni_sem_signal((long)handle + 0x68);
  uni_sem_wait((long)handle + 0x70,0xffffffff);
  *(undefined8 *)((long)handle + 0x40) = 0;
  *(undefined8 *)((long)handle + 0x48) = 0;
  *(undefined8 *)((long)handle + 0x50) = 0;
  *(undefined8 *)((long)handle + 0x58) = 0;
  _consume_event_list((EventList *)handle);
  uni_mutex_free((long)handle + 0x60);
  uni_sem_free((long)handle + 0x68);
  uni_sem_free((long)handle + 0x70);
  free(handle);
  return 0;
}

Assistant:

int EventListDestroy(EventListHandle handle) {
  EventList *event_list = (EventList *)handle;
  _worker_thread_exit(event_list);
  _destroy_all(event_list);
  return 0;
}